

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall ACSStringPool::ReadStrings(ACSStringPool *this,FSerializer *file,char *key)

{
  char *data;
  bool bVar1;
  uint in_EAX;
  uint uVar2;
  DWORD DVar3;
  PoolEntry *p;
  PoolEntry *pPVar4;
  FSerializer *this_00;
  long lVar5;
  uint uVar6;
  TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry> *__range2;
  uint ii;
  int poolsize;
  undefined8 local_38;
  
  local_38._0_4_ = in_EAX;
  Clear(this);
  bVar1 = FSerializer::BeginObject(file,key);
  if (bVar1) {
    local_38 = (ulong)(uint)local_38;
    FSerializer::operator()(file,"poolsize",(int *)((long)&local_38 + 4));
    TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Resize(&this->Pool,local_38._4_4_);
    pPVar4 = (this->Pool).Array;
    for (lVar5 = (ulong)(this->Pool).Count * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
      pPVar4->Next = 0xfffffffe;
      pPVar4->LockCount = 0;
      pPVar4 = pPVar4 + 1;
    }
    bVar1 = FSerializer::BeginArray(file,"pool");
    if (bVar1) {
      uVar2 = FSerializer::ArraySize(file);
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      while (uVar6 = uVar2 - 1, uVar2 != 0) {
        bVar1 = FSerializer::BeginObject(file,(char *)0x0);
        uVar2 = uVar6;
        if (bVar1) {
          local_38 = CONCAT44(local_38._4_4_,0xffffffff);
          FSerializer::operator()(file,"index",(uint *)&local_38);
          if ((uint)local_38 < (this->Pool).Count) {
            this_00 = FSerializer::operator()
                                (file,"string",&(this->Pool).Array[local_38 & 0xffffffff].Str);
            FSerializer::operator()
                      (this_00,"lockcount",&(this->Pool).Array[local_38 & 0xffffffff].LockCount);
            data = (this->Pool).Array[local_38 & 0xffffffff].Str.Chars;
            DVar3 = SuperFastHash(data,(ulong)*(uint *)(data + -0xc));
            pPVar4 = (this->Pool).Array;
            pPVar4[local_38 & 0xffffffff].Hash = DVar3;
            pPVar4[local_38 & 0xffffffff].Next = this->PoolBuckets[(ulong)DVar3 % 0xfb];
            this->PoolBuckets[(ulong)DVar3 % 0xfb] = (uint)local_38;
          }
          FSerializer::EndObject(file);
        }
      }
    }
  }
  return;
}

Assistant:

void ACSStringPool::ReadStrings(FSerializer &file, const char *key)
{
	Clear();

	if (file.BeginObject(key))
	{
		int poolsize = 0;

		file("poolsize", poolsize);
		Pool.Resize(poolsize);
		for (auto &p : Pool)
		{
			p.Next = FREE_ENTRY;
			p.LockCount = 0;
		}
		if (file.BeginArray("pool"))
		{
			int j = file.ArraySize();
			for (int i = 0; i < j; i++)
			{
				if (file.BeginObject(nullptr))
				{
					unsigned ii = UINT_MAX;
					file("index", ii);
					if (ii < Pool.Size())
					{
						file("string", Pool[ii].Str)
							("lockcount", Pool[ii].LockCount);

						unsigned h = SuperFastHash(Pool[ii].Str, Pool[ii].Str.Len());
						unsigned bucketnum = h % NUM_BUCKETS;
						Pool[ii].Hash = h;
						Pool[ii].Next = PoolBuckets[bucketnum];
						PoolBuckets[bucketnum] = ii;
					}
					file.EndObject();
				}
			}
		}
	}
}